

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nhdp_interfaces.c
# Opt level: O0

nhdp_interface * nhdp_interface_add(char *name)

{
  list_entity *plVar1;
  long lVar2;
  oonf_rfc5444_interface *poVar3;
  nhdp_interface *local_78;
  nhdp_interface *local_70;
  nhdp_interface *interf;
  char *name_local;
  
  lVar2 = avl_find(&_interface_tree,name);
  if (lVar2 == 0) {
    local_78 = (nhdp_interface *)0x0;
  }
  else {
    local_78 = (nhdp_interface *)(lVar2 + -0x158);
  }
  local_70 = local_78;
  if (local_78 == (nhdp_interface *)0x0) {
    local_70 = (nhdp_interface *)oonf_class_malloc(&_interface_info);
    if (local_70 == (nhdp_interface *)0x0) {
      if (((&log_global_mask)[LOG_NHDP] & 4) != 0) {
        oonf_log(4,LOG_NHDP,"src/nhdp/nhdp/nhdp_interfaces.c",0xd6,0,0,
                 "No memory left for NHDP interface");
      }
      return (nhdp_interface *)0x0;
    }
    (local_70->rfc5444_if).cb_interface_changed = _cb_interface_event;
    poVar3 = oonf_rfc5444_add_interface(_protocol,(oonf_rfc5444_interface_listener *)local_70,name);
    if (poVar3 == (oonf_rfc5444_interface *)0x0) {
      oonf_class_free(&_interface_info,local_70);
      if (((&log_global_mask)[LOG_NHDP] & 4) != 0) {
        oonf_log(4,LOG_NHDP,"src/nhdp/nhdp/nhdp_interfaces.c",0xdd,0,0,
                 "Cannot allocate rfc5444 interface for %s",name);
      }
      return (nhdp_interface *)0x0;
    }
    (local_70->os_if_listener).name = ((local_70->rfc5444_if).interface)->name;
    os_interface_linux_add(&local_70->os_if_listener);
    (local_70->_hello_timer).class = &_interface_hello_timer;
    (local_70->_node).key = (local_70->rfc5444_if).interface;
    avl_insert(&_interface_tree,&local_70->_node);
    avl_init(&local_70->_if_addresses,avl_comp_netaddr,0);
    plVar1 = &local_70->_links;
    (local_70->_links).prev = plVar1;
    plVar1->next = plVar1;
    avl_init(&local_70->_link_addresses,avl_comp_netaddr,0);
    avl_init(&local_70->_link_originators,avl_comp_netaddr,1);
    avl_init(&local_70->_if_twohops,avl_comp_netaddr,1);
    oonf_class_event(&_interface_info,local_70,OONF_OBJECT_ADDED);
  }
  if (((&log_global_mask)[LOG_NHDP] & 2) != 0) {
    oonf_log(2,LOG_NHDP,"src/nhdp/nhdp/nhdp_interfaces.c",0x106,0,0,
             "Add interface to NHDP_interface tree: %s (refcount was %d)",name,local_70->_refcount);
  }
  local_70->_refcount = local_70->_refcount + 1;
  return local_70;
}

Assistant:

struct nhdp_interface *
nhdp_interface_add(const char *name) {
  struct nhdp_interface *interf;

  interf = avl_find_element(&_interface_tree, name, interf, _node);
  if (interf == NULL) {
    interf = oonf_class_malloc(&_interface_info);
    if (interf == NULL) {
      OONF_WARN(LOG_NHDP, "No memory left for NHDP interface");
      return NULL;
    }

    interf->rfc5444_if.cb_interface_changed = _cb_interface_event;
    if (!oonf_rfc5444_add_interface(_protocol, &interf->rfc5444_if, name)) {
      oonf_class_free(&_interface_info, interf);
      OONF_WARN(LOG_NHDP, "Cannot allocate rfc5444 interface for %s", name);
      return NULL;
    }

    /* allocate core interface */
    interf->os_if_listener.name = interf->rfc5444_if.interface->name;
    os_interface_add(&interf->os_if_listener);

    /* initialize timers */
    interf->_hello_timer.class = &_interface_hello_timer;

    /* hook into global interface tree */
    interf->_node.key = interf->rfc5444_if.interface->name;
    avl_insert(&_interface_tree, &interf->_node);

    /* init address tree */
    avl_init(&interf->_if_addresses, avl_comp_netaddr, false);

    /* init link list */
    list_init_head(&interf->_links);

    /* init link address tree */
    avl_init(&interf->_link_addresses, avl_comp_netaddr, false);

    /*
     * init originator tree
     * (might temporarily have multiple links with the same originator)
     */
    avl_init(&interf->_link_originators, avl_comp_netaddr, true);

    /*
     * init twohop tree
     * (this tree allows duplicates to easily find all links to a
     * twohop link address)
     */
    avl_init(&interf->_if_twohops, avl_comp_netaddr, true);

    /* trigger event */
    oonf_class_event(&_interface_info, interf, OONF_OBJECT_ADDED);
  }

  OONF_INFO(LOG_NHDP, "Add interface to NHDP_interface tree: %s (refcount was %d)", name, interf->_refcount);

  /* keep track of users */
  interf->_refcount++;

  return interf;
}